

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_unpacked.c
# Opt level: O0

void * UNPK_addEntry(void *opaque,char *name,int isdir,PHYSFS_sint64 ctime,PHYSFS_sint64 mtime,
                    PHYSFS_uint64 pos,PHYSFS_uint64 len)

{
  PHYSFS_uint64 local_60;
  PHYSFS_uint64 local_58;
  UNPKentry *entry;
  UNPKinfo *info;
  PHYSFS_uint64 pos_local;
  PHYSFS_sint64 mtime_local;
  PHYSFS_sint64 ctime_local;
  int isdir_local;
  char *name_local;
  void *opaque_local;
  
  opaque_local = __PHYSFS_DirTreeAdd((__PHYSFS_DirTree *)opaque,name,isdir);
  if (opaque_local == (void *)0x0) {
    opaque_local = (void *)0x0;
  }
  else {
    local_58 = pos;
    if (isdir != 0) {
      local_58 = 0;
    }
    *(PHYSFS_uint64 *)((long)opaque_local + 0x28) = local_58;
    if (isdir == 0) {
      local_60 = len;
    }
    else {
      local_60 = 0;
    }
    *(PHYSFS_uint64 *)((long)opaque_local + 0x30) = local_60;
    *(PHYSFS_sint64 *)((long)opaque_local + 0x38) = ctime;
    *(PHYSFS_sint64 *)((long)opaque_local + 0x40) = mtime;
  }
  return opaque_local;
}

Assistant:

void *UNPK_addEntry(void *opaque, char *name, const int isdir,
                    const PHYSFS_sint64 ctime, const PHYSFS_sint64 mtime,
                    const PHYSFS_uint64 pos, const PHYSFS_uint64 len)
{
    UNPKinfo *info = (UNPKinfo *) opaque;
    UNPKentry *entry;

    entry = (UNPKentry *) __PHYSFS_DirTreeAdd(&info->tree, name, isdir);
    BAIL_IF_ERRPASS(!entry, NULL);

    entry->startPos = isdir ? 0 : pos;
    entry->size = isdir ? 0 : len;
    entry->ctime = ctime;
    entry->mtime = mtime;

    return entry;
}